

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlc.h
# Opt level: O1

int Wlc_ObjIsSignedFanin01(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar2;
  
  if (p->fSmtLib != 0) {
LAB_008afda1:
    return *(uint *)pObj >> 6 & 1;
  }
  if ((pObj->nFanins < 3) &&
     ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) != (undefined1  [24])0x6)
     ) {
    paVar2 = &pObj->field_10;
  }
  else {
    paVar2 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
  }
  iVar1 = paVar2->Fanins[0];
  if ((0 < (long)iVar1) && (iVar1 < p->nObjsAlloc)) {
    if ((undefined1  [24])((undefined1  [24])p->pObjs[iVar1] & (undefined1  [24])0x40) ==
        (undefined1  [24])0x0) {
      return 0;
    }
    if ((pObj->nFanins < 3) &&
       ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) !=
        (undefined1  [24])0x6)) {
      paVar2 = &pObj->field_10;
    }
    else {
      paVar2 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
    }
    iVar1 = paVar2->Fanins[1];
    if ((0 < (long)iVar1) && (iVar1 < p->nObjsAlloc)) {
      pObj = p->pObjs + iVar1;
      goto LAB_008afda1;
    }
  }
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

static inline int          Wlc_ObjIsSignedFanin01( Wlc_Ntk_t * p, Wlc_Obj_t * pObj ){ return p->fSmtLib ? Wlc_ObjIsSigned(pObj) : (Wlc_ObjFanin0(p, pObj)->Signed && Wlc_ObjFanin1(p, pObj)->Signed); }